

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestRunStats::~TestRunStats(TestRunStats *this)

{
  pointer pcVar1;
  
  this->_vptr_TestRunStats = (_func_int **)&PTR__TestRunStats_0026c280;
  pcVar1 = (this->runInfo).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->runInfo).name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

TestRunStats::~TestRunStats() = default;